

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O3

void Eigen::internal::
     call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::Replicate<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1>const>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,
               CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>
               *src)

{
  long lVar1;
  long lVar2;
  Index col;
  long lVar3;
  long lVar4;
  double *pdVar5;
  assign_op<double,_double> local_89 [9];
  product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  local_80;
  MatrixTypeNested local_58;
  double *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  product_evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  ::product_evaluator(&local_80,&src->m_lhs);
  local_58 = (src->m_rhs).m_matrix;
  local_50 = (local_58->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
  local_48 = (local_58->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_rows;
  lStack_38 = (local_58->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
              .m_cols;
  local_40 = local_48;
  resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::Replicate<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1>const>,double,double>
            (dst,src,local_89);
  lVar1 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (0 < lVar1) {
    pdVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    lVar2 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
    ;
    lVar3 = 0;
    do {
      if (0 < lVar2) {
        lVar4 = 0;
        do {
          pdVar5[lVar4] =
               local_50[(lVar3 % lStack_38) * local_48 + lVar4 % local_40] +
               local_80.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.
               m_data[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar2 != lVar4);
      }
      lVar3 = lVar3 + 1;
      local_80.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_data =
           local_80.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.
           m_data + local_80.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    .m_outerStride.m_value;
      pdVar5 = pdVar5 + lVar2;
    } while (lVar3 != lVar1);
  }
  free(local_80.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_assignment(Dst& dst, const Src& src)
{
  call_assignment(dst, src, internal::assign_op<typename Dst::Scalar,typename Src::Scalar>());
}